

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

SharedExNdPtr __thiscall
front::syntax::SyntaxAnalyze::computeIndex(SyntaxAnalyze *this,SharedSyPtr *arr,SharedExNdPtr *node)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  undefined8 *puVar3;
  SharedSyPtr *pSVar4;
  SyntaxAnalyze *pSVar5;
  long lVar6;
  ExpressNode *pEVar7;
  ExpressNode *pEVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  long lVar10;
  irGenerator *this_00;
  ulong uVar11;
  SharedExNdPtr SVar12;
  SharedExNdPtr byteIndex;
  SharedExNdPtr index;
  SharedExNdPtr index2;
  string tmpOff;
  SharedExNdPtr addNode;
  string tmpPtr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e0;
  ExpressNode *local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d0;
  string local_3c8;
  long *local_3a8;
  ExpressNode *local_3a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_398;
  undefined1 *local_390;
  long local_388;
  undefined1 local_380;
  undefined7 uStack_37f;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  byte local_350;
  irGenerator *local_348;
  ExpressNode *local_340;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_338;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  byte local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  SharedSyPtr *local_2e8;
  element_type *local_2e0;
  SharedExNdPtr local_2d8;
  SharedExNdPtr local_2c8;
  SharedExNdPtr local_2b8;
  SharedExNdPtr local_2a8;
  SharedExNdPtr local_298;
  SharedExNdPtr local_288;
  SharedExNdPtr local_278;
  SyntaxAnalyze *local_268;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  byte local_240;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  byte local_218;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  byte local_1f0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  byte local_1c8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  byte local_1a0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  byte local_178;
  RightVal local_170;
  RightVal local_148;
  RightVal local_120;
  RightVal local_f8;
  RightVal local_d0;
  RightVal local_a8;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_2e0 = (node->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  p_Var1 = (node->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_3a8 = in_RCX;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_308._M_string_length = 0;
  local_308.field_2._M_local_buf[0] = '\0';
  local_390 = &local_380;
  local_388 = 0;
  local_380 = 0;
  local_330._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_310 = 0;
  local_370._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_350 = 0;
  local_3d8 = (ExpressNode *)**(long **)(*local_3a8 + 0x30);
  local_3d0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(*local_3a8 + 0x30))[1];
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
    }
  }
  lVar6 = *(long *)(local_2e0 + 1);
  local_2e8 = arr;
  local_268 = this;
  if (0x10 < (ulong)(*(long *)&local_2e0[1]._value - lVar6)) {
    local_348 = (irGenerator *)(arr + 8);
    uVar11 = 1;
    lVar10 = 0x18;
    do {
      peVar2 = *(element_type **)(lVar6 + -8 + lVar10);
      p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + lVar10);
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      pEVar7 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar7);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                (&local_3e0,pEVar7);
      pEVar8 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar8);
      local_340 = pEVar8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                (&local_338,pEVar8);
      pEVar8 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar8);
      local_3a0 = pEVar8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                (&local_398,pEVar8);
      lVar6 = *(long *)(*local_3a8 + 0x30);
      if (uVar11 < (ulong)(*(long *)(*local_3a8 + 0x38) - lVar6 >> 4)) {
        local_3a0 = *(ExpressNode **)(lVar6 + -8 + lVar10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_398,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar6 + lVar10));
      }
      else {
        local_3a0->_type = CNS;
        local_3a0->_operation = NUMBER;
        local_3a0->_value = 0;
      }
      pEVar7->_operation = MUL;
      if ((local_3d8->_type == CNS) && (peVar2->_type == CNS)) {
        pEVar7->_type = CNS;
        pEVar7->_value = peVar2->_value * local_3d8->_value;
      }
      else {
        if (local_388 == 0) {
          irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_3c8,local_348,Int);
          std::__cxx11::string::operator=((string *)&local_390,(string *)&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
        }
        pEVar7->_type = VAR;
        std::__cxx11::string::_M_assign((string *)&pEVar7->_name);
        pEVar8 = local_3d8;
        if (local_3d8->_type == CNS) {
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr[local_310]._M_data)
                    ((anon_class_1_0_00000001 *)&local_3c8,
                     (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_330._M_first);
          local_330._M_first._M_storage = (_Uninitialized<int,_true>)pEVar8->_value;
          local_310 = 0;
          std::get<0ul,int,int,std::__cxx11::string>
                    ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_330._M_first);
        }
        else {
          std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                    ((variant<int,int,std::__cxx11::string> *)&local_330._M_first,&local_3d8->_name)
          ;
        }
        if (peVar2->_type == CNS) {
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr[local_350]._M_data)
                    ((anon_class_1_0_00000001 *)&local_3c8,
                     (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_370._M_first);
          local_370._M_first._M_storage = (_Uninitialized<int,_true>)peVar2->_value;
          local_350 = 0;
          std::get<0ul,int,int,std::__cxx11::string>
                    ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_370._M_first);
        }
        else {
          std::variant<int,int,std::__cxx11::string>::operator=
                    ((variant<int,int,std::__cxx11::string> *)&local_370._M_first,&peVar2->_name);
        }
        local_238._0_8_ = (long)&local_238 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,local_390,local_390 + local_388);
        local_218 = 1;
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_148,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_330._M_first);
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_58,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_370._M_first);
        irGenerator::irGenerator::ir_op
                  (local_348,(LeftVal *)&local_238._M_first,&local_148,&local_58,Mul);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [local_58.
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)&local_3c8,&local_58);
        local_58.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [local_148.
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)&local_3c8,&local_148);
        local_148.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_218]._M_data)
                  ((anon_class_1_0_00000001 *)&local_3c8,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_238._M_first);
        local_218 = 0xff;
      }
      local_278.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_3d8;
      local_278.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_3d0._M_pi;
      if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
        }
      }
      express::ExpressNode::addChild(pEVar7,&local_278);
      if (local_278.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_278.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      local_288.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      local_288.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var1;
      express::ExpressNode::addChild(pEVar7,&local_288);
      if (local_288.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_340->_operation = PLUS;
      if ((pEVar7->_type == CNS) && (local_3a0->_type == CNS)) {
        local_340->_type = CNS;
        local_340->_value = local_3a0->_value + pEVar7->_value;
      }
      else {
        if (local_388 == 0) {
          irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_3c8,local_348,Int);
          std::__cxx11::string::operator=((string *)&local_390,(string *)&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
        }
        local_340->_type = VAR;
        std::__cxx11::string::_M_assign((string *)&local_340->_name);
        if (pEVar7->_type == CNS) {
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr[local_310]._M_data)
                    ((anon_class_1_0_00000001 *)&local_3c8,
                     (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_330._M_first);
          local_330._M_first._M_storage = (_Uninitialized<int,_true>)pEVar7->_value;
          local_310 = 0;
          std::get<0ul,int,int,std::__cxx11::string>
                    ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_330._M_first);
        }
        else {
          std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                    ((variant<int,int,std::__cxx11::string> *)&local_330._M_first,&pEVar7->_name);
        }
        pEVar8 = local_3a0;
        if (local_3a0->_type == CNS) {
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr[local_350]._M_data)
                    ((anon_class_1_0_00000001 *)&local_3c8,
                     (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_370._M_first);
          local_370._M_first._M_storage = (_Uninitialized<int,_true>)pEVar8->_value;
          local_350 = 0;
          std::get<0ul,int,int,std::__cxx11::string>
                    ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_370._M_first);
        }
        else {
          std::variant<int,int,std::__cxx11::string>::operator=
                    ((variant<int,int,std::__cxx11::string> *)&local_370._M_first,&local_3a0->_name)
          ;
        }
        local_260._0_8_ = (long)&local_260 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_260,local_390,local_390 + local_388);
        local_240 = 1;
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_170,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_330._M_first);
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_80,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_370._M_first);
        irGenerator::irGenerator::ir_op
                  (local_348,(LeftVal *)&local_260._M_first,&local_170,&local_80,Add);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [local_80.
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)&local_3c8,&local_80);
        local_80.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [local_170.
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)&local_3c8,&local_170);
        local_170.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_240]._M_data)
                  ((anon_class_1_0_00000001 *)&local_3c8,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_260._M_first);
        local_240 = 0xff;
      }
      local_298.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_3e0._M_pi;
      if (local_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_3e0._M_pi)->_M_use_count = (local_3e0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_3e0._M_pi)->_M_use_count = (local_3e0._M_pi)->_M_use_count + 1;
        }
      }
      local_298.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pEVar7;
      express::ExpressNode::addChild(local_340,&local_298);
      if (local_298.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_298.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_2a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_3a0;
      local_2a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_398._M_pi;
      if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
        }
      }
      express::ExpressNode::addChild(local_340,&local_2a8);
      if (local_2a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2a8.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_3d8 = local_340;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_3d0,&local_338);
      if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
      }
      if (local_338._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338._M_pi);
      }
      if (local_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0._M_pi);
      }
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      uVar11 = uVar11 + 1;
      lVar6 = *(long *)(local_2e0 + 1);
      lVar10 = lVar10 + 0x10;
    } while (uVar11 < (ulong)(*(long *)&local_2e0[1]._value - lVar6 >> 4));
  }
  pEVar7 = (ExpressNode *)operator_new(0x48);
  pSVar4 = local_2e8;
  express::ExpressNode::ExpressNode(pEVar7);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
            (&local_3e0,pEVar7);
  pSVar5 = local_268;
  pEVar7->_operation = MUL;
  if (local_3d8->_type == CNS) {
    pEVar7->_type = CNS;
    pEVar7->_value = local_3d8->_value << 2;
  }
  else {
    if (local_388 == 0) {
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                (&local_3c8,(irGenerator *)(pSVar4 + 8),Int);
      std::__cxx11::string::operator=((string *)&local_390,(string *)&local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
    }
    pEVar7->_type = VAR;
    std::__cxx11::string::_M_assign((string *)&pEVar7->_name);
    std::variant<int,int,std::__cxx11::string>::operator=
              ((variant<int,int,std::__cxx11::string> *)&local_330._M_first,&local_3d8->_name);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_350]._M_data)
              ((anon_class_1_0_00000001 *)&local_3c8,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_370._M_first);
    local_370._M_first._M_storage = (_Uninitialized<int,_true>)4;
    local_350 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_370._M_first);
    local_1c0._0_8_ = (long)&local_1c0 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1c0,local_390,local_390 + local_388);
    local_1a0 = 1;
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a8,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_330._M_first);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d0,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_370._M_first);
    irGenerator::irGenerator::ir_op
              ((irGenerator *)(pSVar4 + 8),(LeftVal *)&local_1c0._M_first,&local_a8,&local_d0,Mul);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_d0.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              ((anon_class_1_0_00000001 *)&local_3c8,&local_d0);
    local_d0.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_a8.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              ((anon_class_1_0_00000001 *)&local_3c8,&local_a8);
    local_a8.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_1a0]._M_data)
              ((anon_class_1_0_00000001 *)&local_3c8,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1c0._M_first);
    local_1a0 = 0xff;
  }
  local_2b8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_3d8;
  local_2b8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_3d0._M_pi;
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
    }
  }
  express::ExpressNode::addChild(pEVar7,&local_2b8);
  if (local_2b8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_3d8 = pEVar7;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_3d0,&local_3e0);
  pEVar7 = (ExpressNode *)operator_new(0x48);
  express::ExpressNode::ExpressNode(pEVar7);
  *(ExpressNode **)pSVar5 = pEVar7;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pSVar5->matched_index,pEVar7);
  this_00 = (irGenerator *)(pSVar4 + 8);
  irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_3c8,this_00,Ptr);
  std::__cxx11::string::operator=((string *)&local_308,(string *)&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  puVar3 = *(undefined8 **)pSVar5;
  *puVar3 = 0x600000001;
  __rhs = &local_308;
  std::__cxx11::string::_M_assign((string *)(puVar3 + 2));
  pEVar7 = *(ExpressNode **)pSVar5;
  local_2c8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*local_3a8;
  local_2c8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8[1];
  if (local_2c8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2c8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_2c8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2c8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_2c8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  express::ExpressNode::addChild(pEVar7,&local_2c8);
  if (local_2c8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pEVar7 = *(ExpressNode **)pSVar5;
  local_2d8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_3d8;
  local_2d8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_3d0._M_pi;
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
    }
  }
  express::ExpressNode::addChild(pEVar7,&local_2d8);
  if (local_2d8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (*(int *)(*local_3a8 + 4) == 3) {
    local_1e8._0_8_ = (long)&local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_308._M_dataplus._M_p,
               local_308._M_dataplus._M_p + local_308._M_string_length);
    local_1c8 = 1;
    local_198._0_8_ = (long)&local_198 + 0x10;
    lVar6 = *(long *)(*local_3a8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,lVar6,*(long *)(*local_3a8 + 0x18) + lVar6);
    local_178 = 1;
    irGenerator::irGenerator::ir_ref
              (this_00,(LeftVal *)&local_1e8._M_first,(LeftVal *)&local_198._M_first,false);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_178]._M_data)
              ((anon_class_1_0_00000001 *)&local_3c8,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_198._M_first);
    local_178 = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_1c8]._M_data)
              ((anon_class_1_0_00000001 *)&local_3c8,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1e8._M_first);
    local_1c8 = 0xff;
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*local_3a8 + 0x10)
    ;
  }
  std::variant<int,int,std::__cxx11::string>::operator=
            ((variant<int,int,std::__cxx11::string> *)&local_330._M_first,__rhs);
  pEVar7 = local_3d8;
  if (local_3d8->_type == CNS) {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_350]._M_data)
              ((anon_class_1_0_00000001 *)&local_3c8,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_370._M_first);
    local_370._M_first._M_storage = (_Uninitialized<int,_true>)pEVar7->_value;
    local_350 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_370._M_first);
  }
  else {
    std::variant<int,int,std::__cxx11::string>::operator=
              ((variant<int,int,std::__cxx11::string> *)&local_370._M_first,&local_3d8->_name);
  }
  local_210._0_8_ = (long)&local_210 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_308._M_dataplus._M_p,
             local_308._M_dataplus._M_p + local_308._M_string_length);
  local_1f0 = 1;
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_f8,
                    (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_330._M_first);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_120,
                    (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_370._M_first);
  irGenerator::irGenerator::ir_op(this_00,(LeftVal *)&local_210._M_first,&local_f8,&local_120,Add);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_120.
     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)&local_3c8,&local_120);
  local_120.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_f8.
     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)&local_3c8,&local_f8);
  local_f8.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_1f0]._M_data)
            ((anon_class_1_0_00000001 *)&local_3c8,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_210._M_first);
  local_1f0 = 0xff;
  if (local_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0._M_pi);
  }
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d0._M_pi);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_350]._M_data)
            ((anon_class_1_0_00000001 *)&local_3c8,
             (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_370._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_310]._M_data)
            ((anon_class_1_0_00000001 *)&local_370._M_first,
             (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_330._M_first);
  _Var9._M_pi = extraout_RDX;
  if (local_390 != &local_380) {
    operator_delete(local_390,CONCAT71(uStack_37f,local_380) + 1);
    _Var9._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,
                    CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                             local_308.field_2._M_local_buf[0]) + 1);
    _Var9._M_pi = extraout_RDX_01;
  }
  SVar12.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var9._M_pi;
  SVar12.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pSVar5;
  return (SharedExNdPtr)
         SVar12.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::computeIndex(SharedSyPtr arr, SharedExNdPtr node) {
  vector<SharedExNdPtr> &dimesions =
      std::static_pointer_cast<ArraySymbol>(arr)->_dimensions;
  string tmpPtr;
  string tmpOff;
  RightVal rightvalue1;
  RightVal rightvalue2;
  SharedExNdPtr index = node->_children.front();
  size_t i;

  // in function, there should be a virtual d in dimensions.at(0)
  for (i = 1; i < dimesions.size(); i++) {
    SharedExNdPtr d = dimesions.at(i);

    SharedExNdPtr mulNode = SharedExNdPtr(new ExpressNode());
    SharedExNdPtr addNode = SharedExNdPtr(new ExpressNode());
    SharedExNdPtr index2 = SharedExNdPtr(new ExpressNode());

    if (i < node->_children.size()) {
      index2 = node->_children.at(i);
    } else {
      index2->_type = NodeType::CNS;
      index2->_operation = OperationType::NUMBER;
      index2->_value = 0;
    }

    mulNode->_operation = OperationType::MUL;
    if (index->_type == NodeType::CNS && d->_type == NodeType::CNS) {
      mulNode->_type = NodeType::CNS;
      mulNode->_value = index->_value * d->_value;
    } else {
      if (tmpOff.empty()) {
        tmpOff = irGenerator.getNewTmpValueName(TyKind::Int);
      }

      mulNode->_type = NodeType::VAR;
      mulNode->_name = tmpOff;
      if (index->_type == NodeType::CNS) {
        rightvalue1.emplace<0>(index->_value);
      } else {
        rightvalue1.emplace<2>(index->_name);
      }
      if (d->_type == NodeType::CNS) {
        rightvalue2.emplace<0>(d->_value);
      } else {
        rightvalue2 = d->_name;
      }
      irGenerator.ir_op(tmpOff, rightvalue1, rightvalue2, Op::Mul);
    }
    mulNode->addChild(index);
    mulNode->addChild(d);

    addNode->_operation = OperationType::PLUS;
    if (mulNode->_type == NodeType::CNS && index2->_type == NodeType::CNS) {
      addNode->_type = NodeType::CNS;
      addNode->_value = mulNode->_value + index2->_value;
    } else {
      if (tmpOff.empty()) {
        tmpOff = irGenerator.getNewTmpValueName(TyKind::Int);
      }

      addNode->_type = NodeType::VAR;
      addNode->_name = tmpOff;
      if (mulNode->_type == NodeType::CNS) {
        rightvalue1.emplace<0>(mulNode->_value);
      } else {
        rightvalue1.emplace<2>(mulNode->_name);
      }
      if (index2->_type == NodeType::CNS) {
        rightvalue2.emplace<0>(index2->_value);
      } else {
        rightvalue2 = index2->_name;
      }
      irGenerator.ir_op(tmpOff, rightvalue1, rightvalue2, Op::Add);
    }
    addNode->addChild(mulNode);
    addNode->addChild(index2);

    index = addNode;
  }

  SharedExNdPtr byteIndex = SharedExNdPtr(new ExpressNode());
  byteIndex->_operation = OperationType::MUL;
  if (index->_type == NodeType::CNS) {
    byteIndex->_type = NodeType::CNS;
    byteIndex->_value = index->_value * mir::types::INT_SIZE;
  } else {
    if (tmpOff.empty()) {
      tmpOff = irGenerator.getNewTmpValueName(TyKind::Int);
    }

    byteIndex->_type = NodeType::VAR;
    byteIndex->_name = tmpOff;

    rightvalue1 = index->_name;
    rightvalue2.emplace<0>(mir::types::INT_SIZE);

    irGenerator.ir_op(tmpOff, rightvalue1, rightvalue2, Op::Mul);
  }
  byteIndex->addChild(index);
  index = byteIndex;

  SharedExNdPtr addr = SharedExNdPtr(new ExpressNode());
  tmpPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);

  addr->_type = NodeType::VAR;
  addr->_operation = OperationType::PTR;
  addr->_name = tmpPtr;
  addr->addChild(node);
  addr->addChild(index);

  if (node->_operation == OperationType::ARR) {
    irGenerator.ir_ref(tmpPtr, node->_name);
    rightvalue1 = tmpPtr;
  } else {
    rightvalue1 = node->_name;
  }
  if (index->_type == NodeType::CNS) {
    rightvalue2.emplace<0>(index->_value);
  } else {
    rightvalue2 = index->_name;
  }
  irGenerator.ir_op(tmpPtr, rightvalue1, rightvalue2, Op::Add);

  return addr;
}